

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O3

void stbir__decode_float_linear_BGRA(float *decodep,int width_times_channels,void *inputp)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float *pfVar17;
  float *decode;
  float *pfVar18;
  
  pfVar1 = decodep + width_times_channels;
  if (width_times_channels < 0x10) {
    if (3 < width_times_channels) {
      pfVar18 = decodep + 4;
      pfVar17 = (float *)((long)inputp + 0xc);
      do {
        pfVar18[-4] = pfVar17[-1];
        pfVar18[-3] = pfVar17[-2];
        pfVar18[-2] = pfVar17[-3];
        pfVar18[-1] = *pfVar17;
        pfVar18 = pfVar18 + 4;
        pfVar17 = pfVar17 + 4;
      } while (pfVar18 <= pfVar1);
    }
  }
  else {
    pfVar17 = (float *)inputp;
    do {
      do {
        fVar2 = *pfVar17;
        fVar3 = pfVar17[1];
        fVar4 = pfVar17[3];
        fVar5 = pfVar17[4];
        fVar6 = pfVar17[5];
        fVar7 = pfVar17[6];
        fVar8 = pfVar17[7];
        fVar9 = pfVar17[8];
        fVar10 = pfVar17[9];
        fVar11 = pfVar17[10];
        fVar12 = pfVar17[0xb];
        fVar13 = pfVar17[0xc];
        fVar14 = pfVar17[0xd];
        fVar15 = pfVar17[0xe];
        fVar16 = pfVar17[0xf];
        *decodep = pfVar17[2];
        decodep[1] = fVar3;
        decodep[2] = fVar2;
        decodep[3] = fVar4;
        decodep[4] = fVar7;
        decodep[5] = fVar6;
        decodep[6] = fVar5;
        decodep[7] = fVar8;
        decodep[8] = fVar11;
        decodep[9] = fVar10;
        decodep[10] = fVar9;
        decodep[0xb] = fVar12;
        decodep[0xc] = fVar15;
        decodep[0xd] = fVar14;
        decodep[0xe] = fVar13;
        decodep[0xf] = fVar16;
        pfVar18 = decodep + 0x10;
        pfVar17 = pfVar17 + 0x10;
        decodep = pfVar18;
      } while (pfVar18 <= pfVar1 + -0x10);
      pfVar17 = (float *)((long)inputp + (long)width_times_channels * 4 + -0x40);
      decodep = pfVar1 + -0x10;
    } while (pfVar18 != pfVar1);
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME(stbir__decode_float_linear)( float * decodep, int width_times_channels, void const * inputp )
{
  #ifdef stbir__decode_swizzle
  float STBIR_STREAMOUT_PTR( * ) decode = decodep;
  float * decode_end = (float*) decode + width_times_channels;
  float const * input = (float const *)inputp;

  #ifdef STBIR_SIMD
  if ( width_times_channels >= 16 )
  {
    float const * end_input_m16 = input + width_times_channels - 16;
    decode_end -= 16;
    STBIR_NO_UNROLL_LOOP_START_INF_FOR
    for(;;)
    {
      STBIR_NO_UNROLL(decode);
      #ifdef stbir__decode_swizzle
      #ifdef STBIR_SIMD8
      {
        stbir__simdf8 of0,of1;
        stbir__simdf8_load( of0, input );
        stbir__simdf8_load( of1, input+8 );
        stbir__decode_simdf8_flip( of0 );
        stbir__decode_simdf8_flip( of1 );
        stbir__simdf8_store( decode, of0 );
        stbir__simdf8_store( decode+8, of1 );
      }
      #else
      {
        stbir__simdf of0,of1,of2,of3;
        stbir__simdf_load( of0, input );
        stbir__simdf_load( of1, input+4 );
        stbir__simdf_load( of2, input+8 );
        stbir__simdf_load( of3, input+12 );
        stbir__decode_simdf4_flip( of0 );
        stbir__decode_simdf4_flip( of1 );
        stbir__decode_simdf4_flip( of2 );
        stbir__decode_simdf4_flip( of3 );
        stbir__simdf_store( decode, of0 );
        stbir__simdf_store( decode+4, of1 );
        stbir__simdf_store( decode+8, of2 );
        stbir__simdf_store( decode+12, of3 );
      }
      #endif
      #endif
      decode += 16;
      input += 16;
      if ( decode <= decode_end )
        continue;
      if ( decode == ( decode_end + 16 ) )
        break;
      decode = decode_end; // backup and do last couple
      input = end_input_m16;
    }
    return;
  }
  #endif

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  decode += 4;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  while( decode <= decode_end )
  {
    STBIR_SIMD_NO_UNROLL(decode);
    decode[0-4] = input[stbir__decode_order0];
    decode[1-4] = input[stbir__decode_order1];
    decode[2-4] = input[stbir__decode_order2];
    decode[3-4] = input[stbir__decode_order3];
    decode += 4;
    input += 4;
  }
  decode -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( decode < decode_end )
  {
    STBIR_NO_UNROLL(decode);
    decode[0] = input[stbir__decode_order0];
    #if stbir__coder_min_num >= 2
    decode[1] = input[stbir__decode_order1];
    #endif
    #if stbir__coder_min_num >= 3
    decode[2] = input[stbir__decode_order2];
    #endif
    decode += stbir__coder_min_num;
    input += stbir__coder_min_num;
  }
  #endif

  #else

  if ( (void*)decodep != inputp )
    STBIR_MEMCPY( decodep, inputp, width_times_channels * sizeof( float ) );

  #endif
}